

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  float fVar1;
  float fVar2;
  double dVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiTableColumnIdx IVar8;
  uint uVar9;
  ImU32 IVar10;
  ImGuiWindow *outer_window_00;
  ImGuiTable *p;
  float *pfVar11;
  char *pcVar12;
  ImGuiTableColumn *pIVar13;
  bool bVar14;
  float fVar15;
  ImRect IVar16;
  float local_204;
  ImRect *local_200;
  float local_1f8;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e0;
  bool local_1da;
  bool local_1d9;
  float local_1c4;
  float local_1bc;
  int local_1b4;
  float local_1a4;
  int local_198;
  int n_1;
  float scale_factor;
  float new_ref_scale_unit;
  float local_124;
  ImGuiTableColumn *pIStack_120;
  float width_auto;
  ImGuiTableColumn *column;
  int local_110;
  int n;
  int stored_size;
  ImPoolIdx local_f4;
  float local_f0;
  int table_idx;
  float outer_padding_explicit;
  float outer_padding_for_border;
  float inner_padding_explicit;
  float inner_spacing_explicit;
  float inner_spacing_for_border;
  bool pad_inner_x;
  bool pad_outer_x;
  ImGuiWindow *local_d0;
  ImGuiWindow *inner_window;
  ImVec2 local_c0;
  ImVec2 local_b8;
  uint local_b0;
  ImGuiWindowFlags child_flags;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 override_content_size;
  ImGuiTableFlags table_last_flags;
  ImGuiID instance_id;
  int instance_no;
  ImGuiTable *table;
  undefined1 local_74 [8];
  ImRect outer_rect;
  ImVec2 local_5c;
  ImVec2 actual_outer_size;
  ImVec2 avail_size;
  bool use_child_window;
  ImGuiWindow *outer_window;
  ImGuiContext *g;
  float inner_width_local;
  ImVec2 *outer_size_local;
  ImGuiTableFlags flags_local;
  int columns_count_local;
  ImGuiID id_local;
  char *name_local;
  
  pIVar6 = GImGui;
  outer_window_00 = GetCurrentWindow();
  if ((outer_window_00->SkipItems & 1U) == 0) {
    bVar14 = false;
    if ((0 < columns_count) && (bVar14 = false, columns_count < 0x41)) {
      bVar14 = true;
    }
    if (!bVar14) {
      __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_tables.cpp"
                    ,0x133,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    if (((flags & 0x1000000U) != 0) && (inner_width < 0.0)) {
      __assert_fail("inner_width >= 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_tables.cpp"
                    ,0x135,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    bVar14 = (flags & 0x3000000U) == 0;
    actual_outer_size = GetContentRegionAvail();
    outer_rect.Max = *outer_size;
    fVar15 = ImMax<float>(actual_outer_size.x,1.0);
    if (bVar14) {
      local_1a4 = 0.0;
    }
    else {
      local_1a4 = ImMax<float>(actual_outer_size.y,1.0);
    }
    local_5c = CalcItemSize(outer_rect.Max,fVar15,local_1a4);
    unique0x10000224 = operator+(&(outer_window_00->DC).CursorPos,&local_5c);
    ImRect::ImRect((ImRect *)local_74,&(outer_window_00->DC).CursorPos,(ImVec2 *)((long)&table + 4))
    ;
    if ((bVar14) || (bVar7 = IsClippedEx((ImRect *)local_74,0,false), !bVar7)) {
      p = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar6->Tables,id);
      if (p->LastFrameActive == pIVar6->FrameCount) {
        local_1b4 = p->InstanceCurrent + 1;
      }
      else {
        local_1b4 = 0;
      }
      override_content_size.y = (float)(id + local_1b4);
      override_content_size.x = (float)p->Flags;
      if ((0 < local_1b4) && (p->ColumnsCount != columns_count)) {
        __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_tables.cpp"
                      ,0x148,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
      p->IsDefaultSizingPolicy = (flags & 0xe000U) == 0;
      uVar9 = TableFixFlags(flags,outer_window_00);
      p->ID = id;
      p->Flags = uVar9;
      p->InstanceCurrent = (ImS16)local_1b4;
      p->LastFrameActive = pIVar6->FrameCount;
      p->InnerWindow = outer_window_00;
      p->OuterWindow = outer_window_00;
      p->ColumnsCount = columns_count;
      p->IsLayoutLocked = false;
      p->InnerWidth = inner_width;
      p->UserOuterSize = *outer_size;
      if (bVar14) {
        (p->InnerRect).Min.x = (float)local_74._0_4_;
        (p->InnerRect).Min.y = (float)local_74._4_4_;
        (p->InnerRect).Max = outer_rect.Min;
        (p->OuterRect).Min = (p->InnerRect).Min;
        (p->OuterRect).Max = (p->InnerRect).Max;
        (p->WorkRect).Min = (p->OuterRect).Min;
        (p->WorkRect).Max = (p->OuterRect).Max;
      }
      else {
        ImVec2::ImVec2(&local_9c,3.4028235e+38,3.4028235e+38);
        if (((uVar9 & 0x1000000) != 0) && ((uVar9 & 0x2000000) == 0)) {
          local_9c.y = 1.1754944e-38;
        }
        if (((uVar9 & 0x1000000) != 0) && (0.0 < inner_width)) {
          local_9c.x = inner_width;
        }
        if ((((local_9c.x != 3.4028235e+38) || (NAN(local_9c.x))) || (local_9c.y != 3.4028235e+38))
           || (NAN(local_9c.y))) {
          if ((local_9c.x != 3.4028235e+38) || (NAN(local_9c.x))) {
            local_1bc = local_9c.x;
          }
          else {
            local_1bc = 0.0;
          }
          if ((local_9c.y != 3.4028235e+38) || (NAN(local_9c.y))) {
            local_1c4 = local_9c.y;
          }
          else {
            local_1c4 = 0.0;
          }
          ImVec2::ImVec2(&local_a4,local_1bc,local_1c4);
          SetNextWindowContentSize(&local_a4);
        }
        if (((uint)override_content_size.x & 0x3000000) == 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,0.0,0.0);
          SetNextWindowScroll((ImVec2 *)&stack0xffffffffffffff54);
        }
        fVar15 = override_content_size.y;
        local_b0 = (uVar9 & 0x1000000) >> 0xd;
        local_b8 = ImRect::GetSize((ImRect *)local_74);
        BeginChildEx(name,(ImGuiID)fVar15,&local_b8,false,local_b0);
        p->InnerWindow = pIVar6->CurrentWindow;
        IVar5 = (p->InnerWindow->WorkRect).Max;
        (p->WorkRect).Min = (p->InnerWindow->WorkRect).Min;
        (p->WorkRect).Max = IVar5;
        IVar16 = ImGuiWindow::Rect(p->InnerWindow);
        local_c0 = IVar16.Max;
        inner_window = (ImGuiWindow *)IVar16.Min;
        (p->OuterRect).Min = (ImVec2)inner_window;
        (p->OuterRect).Max = local_c0;
        pIVar4 = p->InnerWindow;
        (p->InnerRect).Min = (pIVar4->InnerRect).Min;
        (p->InnerRect).Max = (pIVar4->InnerRect).Max;
        fVar15 = (p->InnerWindow->WindowPadding).x;
        bVar14 = false;
        if ((fVar15 == 0.0) && (!NAN(fVar15))) {
          fVar15 = (p->InnerWindow->WindowPadding).y;
          bVar14 = false;
          if ((fVar15 == 0.0) && (!NAN(fVar15))) {
            bVar14 = p->InnerWindow->WindowBorderSize == 0.0;
          }
        }
        if (!bVar14) {
          __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_tables.cpp"
                        ,0x177,
                        "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                       );
        }
      }
      PushOverrideID((ImGuiID)override_content_size.y);
      local_d0 = p->InnerWindow;
      p->HostIndentX = (local_d0->DC).Indent.x;
      (p->HostClipRect).Min = (local_d0->ClipRect).Min;
      (p->HostClipRect).Max = (local_d0->ClipRect).Max;
      p->HostSkipItems = (bool)(local_d0->SkipItems & 1);
      (p->HostBackupWorkRect).Min = (local_d0->WorkRect).Min;
      (p->HostBackupWorkRect).Max = (local_d0->WorkRect).Max;
      (p->HostBackupParentWorkRect).Min = (local_d0->ParentWorkRect).Min;
      (p->HostBackupParentWorkRect).Max = (local_d0->ParentWorkRect).Max;
      (p->HostBackupColumnsOffset).x = (outer_window_00->DC).ColumnsOffset.x;
      p->HostBackupPrevLineSize = (local_d0->DC).PrevLineSize;
      p->HostBackupCurrLineSize = (local_d0->DC).CurrLineSize;
      p->HostBackupCursorMaxPos = (local_d0->DC).CursorMaxPos;
      p->HostBackupItemWidth = (outer_window_00->DC).ItemWidth;
      p->HostBackupItemWidthStackSize = (outer_window_00->DC).ItemWidthStack.Size;
      ImVec2::ImVec2((ImVec2 *)&inner_spacing_for_border,0.0,0.0);
      (local_d0->DC).CurrLineSize = _inner_spacing_for_border;
      (local_d0->DC).PrevLineSize = (local_d0->DC).CurrLineSize;
      if ((uVar9 & 0x400000) == 0) {
        local_1da = (uVar9 & 0x200000) != 0 || (uVar9 & 0x400) != 0;
        local_1d9 = local_1da;
      }
      else {
        local_1d9 = false;
      }
      inner_spacing_explicit._3_1_ = local_1d9;
      inner_spacing_explicit._2_1_ = -((uVar9 & 0x800000) == 0) & 1;
      local_1e0 = 1.0;
      if ((uVar9 & 0x200) == 0) {
        local_1e0 = 0.0;
      }
      inner_padding_explicit = local_1e0;
      if ((inner_spacing_explicit._2_1_ == 0) || ((uVar9 & 0x200) != 0)) {
        local_1e8 = 0.0;
      }
      else {
        local_1e8 = (pIVar6->Style).CellPadding.x;
      }
      outer_padding_for_border = local_1e8;
      if ((inner_spacing_explicit._2_1_ == 0) || ((uVar9 & 0x200) == 0)) {
        local_1ec = 0.0;
      }
      else {
        local_1ec = (pIVar6->Style).CellPadding.x;
      }
      outer_padding_explicit = local_1ec;
      p->CellSpacingX1 = local_1e8 + local_1e0;
      p->CellSpacingX2 = local_1e8;
      p->CellPaddingX = local_1ec;
      p->CellPaddingY = (pIVar6->Style).CellPadding.y;
      local_1f0 = 1.0;
      if ((uVar9 & 0x400) == 0) {
        local_1f0 = 0.0;
      }
      table_idx = (int)local_1f0;
      if (local_1d9 == false) {
        local_1f8 = 0.0;
      }
      else {
        local_1f8 = (pIVar6->Style).CellPadding.x;
      }
      local_f0 = local_1f8;
      p->OuterPaddingX = (local_1f0 + local_1f8) - p->CellPaddingX;
      p->CurrentColumn = -1;
      p->CurrentRow = -1;
      p->RowBgColorCounter = 0;
      *(uint *)&p->field_0x90 = *(uint *)&p->field_0x90 & 0xffff;
      if (local_d0 == outer_window_00) {
        local_200 = &p->WorkRect;
      }
      else {
        local_200 = &local_d0->ClipRect;
      }
      (p->InnerClipRect).Min = local_200->Min;
      (p->InnerClipRect).Max = local_200->Max;
      ImRect::ClipWith(&p->InnerClipRect,&p->WorkRect);
      ImRect::ClipWithFull(&p->InnerClipRect,&p->HostClipRect);
      if ((uVar9 & 0x20000) == 0) {
        local_204 = (local_d0->ClipRect).Max.y;
      }
      else {
        local_204 = ImMin<float>((p->InnerClipRect).Max.y,(local_d0->WorkRect).Max.y);
      }
      (p->InnerClipRect).Max.y = local_204;
      fVar15 = (p->WorkRect).Min.y;
      p->RowPosY2 = fVar15;
      p->RowPosY1 = fVar15;
      p->RowTextBaseline = 0.0;
      p->FreezeRowsCount = '\0';
      p->FreezeRowsRequest = '\0';
      p->FreezeColumnsCount = '\0';
      p->FreezeColumnsRequest = '\0';
      p->IsUnfrozenRows = true;
      p->DeclColumnsCount = '\0';
      IVar10 = GetColorU32(0x2b,1.0);
      p->BorderColorStrong = IVar10;
      IVar10 = GetColorU32(0x2c,1.0);
      p->BorderColorLight = IVar10;
      local_f4 = ImPool<ImGuiTable>::GetIndex(&pIVar6->Tables,p);
      ImGuiPtrOrIndex::ImGuiPtrOrIndex((ImGuiPtrOrIndex *)&stored_size,local_f4);
      ImVector<ImGuiPtrOrIndex>::push_back
                (&pIVar6->CurrentTableStack,(ImGuiPtrOrIndex *)&stored_size);
      pIVar6->CurrentTable = p;
      (outer_window_00->DC).CurrentTableIdx = local_f4;
      if (local_d0 != outer_window_00) {
        (local_d0->DC).CurrentTableIdx = local_f4;
      }
      if ((((uint)override_content_size.x & 2) != 0) && ((uVar9 & 2) == 0)) {
        p->IsResetDisplayOrderRequest = true;
      }
      if ((pIVar6->TablesLastTimeActive).Size <= local_f4) {
        n = -0x40800000;
        ImVector<float>::resize(&pIVar6->TablesLastTimeActive,local_f4 + 1,(float *)&n);
      }
      dVar3 = pIVar6->Time;
      pfVar11 = ImVector<float>::operator[](&pIVar6->TablesLastTimeActive,local_f4);
      *pfVar11 = (float)dVar3;
      p->MemoryCompacted = false;
      local_110 = ImSpan<ImGuiTableColumn>::size(&p->Columns);
      if ((local_110 != 0) && (local_110 != columns_count)) {
        MemFree(p->RawData);
        p->RawData = (void *)0x0;
      }
      if (p->RawData == (void *)0x0) {
        TableBeginInitMemory(p,columns_count);
        p->IsSettingsRequestLoad = true;
        p->IsInitializing = true;
      }
      if ((p->IsResetAllRequest & 1U) != 0) {
        TableResetSettings(p);
      }
      if ((p->IsInitializing & 1U) != 0) {
        p->SettingsOffset = -1;
        p->IsSortSpecsDirty = true;
        p->InstanceInteracted = -1;
        p->ContextPopupColumn = -1;
        p->LastResizedColumn = -1;
        p->ResizedColumn = -1;
        p->ReorderColumn = -1;
        p->AutoFitSingleColumn = -1;
        p->HoveredColumnBorder = -1;
        p->HoveredColumnBody = -1;
        for (column._4_4_ = 0; column._4_4_ < columns_count; column._4_4_ = column._4_4_ + 1) {
          pIStack_120 = ImSpan<ImGuiTableColumn>::operator[](&p->Columns,column._4_4_);
          local_124 = pIStack_120->WidthAuto;
          ImGuiTableColumn::ImGuiTableColumn((ImGuiTableColumn *)&scale_factor);
          memcpy(pIStack_120,&scale_factor,0x66);
          pIStack_120->WidthAuto = local_124;
          pIStack_120->IsPreserveWidthAuto = true;
          IVar8 = (ImGuiTableColumnIdx)column._4_4_;
          pcVar12 = ImSpan<signed_char>::operator[](&p->DisplayOrderToIndex,column._4_4_);
          *pcVar12 = IVar8;
          pIStack_120->DisplayOrder = IVar8;
          pIStack_120->IsEnabledNextFrame = true;
          pIStack_120->IsEnabled = true;
        }
      }
      if ((p->IsSettingsRequestLoad & 1U) != 0) {
        TableLoadSettings(p);
      }
      fVar15 = pIVar6->FontSize;
      if (((p->RefScale != 0.0) || (NAN(p->RefScale))) &&
         ((p->RefScale != fVar15 || (NAN(p->RefScale) || NAN(fVar15))))) {
        fVar1 = p->RefScale;
        for (local_198 = 0; local_198 < columns_count; local_198 = local_198 + 1) {
          pIVar13 = ImSpan<ImGuiTableColumn>::operator[](&p->Columns,local_198);
          fVar2 = pIVar13->WidthRequest;
          pIVar13 = ImSpan<ImGuiTableColumn>::operator[](&p->Columns,local_198);
          pIVar13->WidthRequest = fVar2 * (fVar15 / fVar1);
        }
      }
      p->RefScale = fVar15;
      local_d0->SkipItems = true;
      if (0 < (p->ColumnsNames).Buf.Size) {
        ImVector<char>::resize(&(p->ColumnsNames).Buf,0);
      }
      TableBeginApplyRequests(p);
      name_local._7_1_ = true;
    }
    else {
      ItemSize((ImRect *)local_74,-1.0);
      name_local._7_1_ = false;
    }
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}